

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

Ast __thiscall
lambda::eval(lambda::Ast_const&)::helper::substitute(lambda::Ast_const&,lambda::Ast_const__int_
          (void *this,Ast *expr,Ast *arg,int index)

{
  type tVar1;
  Ast AVar2;
  undefined1 *local_60;
  Ast *local_58;
  anon_class_16_2_151bd7ed local_50;
  anon_class_16_2_d8d072e5 local_40;
  undefined1 local_30 [16];
  Ast *pAStack_20;
  int index_local;
  Ast *arg_local;
  Ast *expr_local;
  
  local_30._12_4_ = index;
  pAStack_20 = arg;
  arg_local = expr;
  expr_local = (Ast *)this;
  ublib::match<lambda::Ast_const&>((ublib *)local_30,expr);
  local_40.arg = pAStack_20;
  local_40.index = (int *)(local_30 + 0xc);
  local_50.index = (int *)pAStack_20;
  local_50.arg = (Ast *)(local_30 + 0xc);
  local_60 = local_30 + 0xc;
  local_58 = pAStack_20;
  tVar1 = ublib::impl::Matcher<lambda::Ast_const&>::operator()
                    ((Matcher<lambda::Ast_const&> *)this,(anon_class_16_2_d8d072e5 *)local_30,
                     &local_40,&local_50,(anon_class_1_0_00000001 *)&local_60);
  AVar2.underlying_.
  super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       tVar1.underlying_.
       super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  AVar2.underlying_.
  super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (Ast)AVar2.underlying_.
              super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Ast substitute(Ast const& expr, Ast const& arg, int index) {
      return ublib::match(expr)(
          [&](Ast::Lambda const& e) {
            return Ast(Ast::Lambda(
                e.variable(), substitute(e.expression(), arg, index + 1)));
          },
          [&](Ast::Call const& e) {
            return Ast(Ast::Call(
                substitute(e.callee(), arg, index),
                substitute(e.argument(), arg, index)));
          },
          [&](Ast::Variable const& e) {
            if (e.index() == index) {
              return arg;
            } else {
              return Ast(e);
            }
          },
          [&](Ast::Free_variable const& e) { return Ast(e); });
    }